

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall vkt::synchronization::anon_unknown_0::VertexGrid::~VertexGrid(VertexGrid *this)

{
  VertexGrid *this_local;
  
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::~MovePtr
            (&this->m_indexBuffer);
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::~MovePtr
            (&this->m_vertexBuffer);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            (&this->m_vertexData);
  return;
}

Assistant:

VertexGrid (OperationContext& context)
	{
		const DeviceInterface&	vk			= context.getDeviceInterface();
		const VkDevice			device		= context.getDevice();
		Allocator&				allocator	= context.getAllocator();

		// Vertex positions
		{
			m_vertexData.push_back(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f));
			m_vertexData.push_back(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f));
			m_vertexData.push_back(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f));

			m_vertexData.push_back(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f));
			m_vertexData.push_back(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f));
			m_vertexData.push_back(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f));
		}
		m_vertexFormat							= VK_FORMAT_R32G32B32A32_SFLOAT;
		m_vertexStride							= tcu::getPixelSize(mapVkFormat(m_vertexFormat));
		const VkDeviceSize vertexDataSizeBytes	= m_vertexData.size() * sizeof(m_vertexData[0]);

		m_vertexBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
			makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible));

		DE_ASSERT(sizeof(m_vertexData[0]) == m_vertexStride);

		{
			const Allocation& alloc = m_vertexBuffer->getAllocation();
			deMemcpy(alloc.getHostPtr(), &m_vertexData[0], static_cast<std::size_t>(vertexDataSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		}

		// Indices
		{
			const VkDeviceSize indexBufferSizeBytes	= sizeof(deUint32) * m_vertexData.size();
			const deUint32 numIndices					= static_cast<deUint32>(m_vertexData.size());
			m_indexBuffer							= de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
				makeBufferCreateInfo(indexBufferSizeBytes, VK_BUFFER_USAGE_INDEX_BUFFER_BIT), MemoryRequirement::HostVisible));

			const Allocation&	alloc	= m_indexBuffer->getAllocation();
			deUint32* const		pData	= static_cast<deUint32*>(alloc.getHostPtr());

			for (deUint32 i = 0; i < numIndices; ++i)
				pData[i] = i;

			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), indexBufferSizeBytes);
		}
	}